

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MenuBar.h
# Opt level: O0

void __thiscall gui::MenuBarStyle::MenuBarStyle(MenuBarStyle *this,MenuBarStyle *param_2)

{
  Style *in_RSI;
  Style *in_RDI;
  RectangleShape *in_stack_ffffffffffffffb8;
  RectangleShape *in_stack_ffffffffffffffc0;
  Text *pTVar1;
  Text *in_stack_ffffffffffffffe0;
  
  Style::Style(in_RDI,in_RSI);
  in_RDI->_vptr_Style = (_func_int **)&PTR__MenuBarStyle_002f7720;
  pTVar1 = (Text *)(in_RDI + 1);
  sf::RectangleShape::RectangleShape(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  sf::RectangleShape::RectangleShape(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  sf::RectangleShape::RectangleShape((RectangleShape *)(in_RDI + 0x2c),in_stack_ffffffffffffffb8);
  sf::Text::Text(in_stack_ffffffffffffffe0,pTVar1);
  memcpy(&in_RDI[0x58].gui_,&in_RSI[0x58].gui_,0x2c);
  return;
}

Assistant:

virtual ~MenuBarStyle() = default;